

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mostream.hh
# Opt level: O0

void __thiscall OpenMesh::multiplex_streambuf::~multiplex_streambuf(multiplex_streambuf *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  tmap_iter t_end;
  tmap_iter t_it;
  multiplex_streambuf *this_local;
  
  *(undefined ***)this = &PTR__multiplex_streambuf_003debb0;
  t_end._M_node =
       (_Base_ptr)
       std::
       map<void_*,_OpenMesh::basic_multiplex_target_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_OpenMesh::basic_multiplex_target_*>_>_>
       ::begin(&this->target_map_);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<void_*,_OpenMesh::basic_multiplex_target_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_OpenMesh::basic_multiplex_target_*>_>_>
       ::end(&this->target_map_);
  while( true ) {
    bVar1 = std::operator!=(&t_end,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<void_*const,_OpenMesh::basic_multiplex_target_*>_>::
             operator->(&t_end);
    if (ppVar2->second != (basic_multiplex_target *)0x0) {
      (*ppVar2->second->_vptr_basic_multiplex_target[1])();
    }
    std::_Rb_tree_iterator<std::pair<void_*const,_OpenMesh::basic_multiplex_target_*>_>::operator++
              (&t_end);
  }
  std::__cxx11::string::~string((string *)&this->buffer_);
  std::
  map<void_*,_OpenMesh::basic_multiplex_target_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_OpenMesh::basic_multiplex_target_*>_>_>
  ::~map(&this->target_map_);
  std::
  vector<OpenMesh::basic_multiplex_target_*,_std::allocator<OpenMesh::basic_multiplex_target_*>_>::
  ~vector(&this->targets_);
  std::streambuf::~streambuf((streambuf *)this);
  return;
}

Assistant:

~multiplex_streambuf()
  {
    tmap_iter t_it(target_map_.begin()), t_end(target_map_.end());
    for (; t_it!=t_end; ++t_it)
      delete t_it->second;
  }